

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::unpack_etc2_color(void *pBlock,uint *pDst_pixels_rgba,bool preserve_alpha)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  component_t *pcVar10;
  byte bVar11;
  color_quad_u8 *local_b8;
  uint local_ac;
  uint local_a8;
  uint c_5;
  uint j_1;
  uint c_4;
  uint i_1;
  uint c_3;
  int16 color [3];
  int16 di [3];
  int16 dj [3];
  int16 base [3];
  uint j;
  uint i;
  uint8 c1;
  uint8 c0;
  uint c_2;
  int iStack_68;
  uint8 delta_1;
  int c_1;
  int d;
  byte local_5b [2];
  uint8 modifier;
  uint c;
  uint8 delta;
  uint8 unpacked [3];
  color_quad_u8 block_colors [4];
  bool gOverflow;
  bool rOverflow;
  uint8 *B;
  etc1_block *block;
  color_quad_u8 *pDst;
  bool preserve_alpha_local;
  uint *pDst_pixels_rgba_local;
  void *pBlock_local;
  
  bVar1 = unpack_etc1_block(pBlock,pDst_pixels_rgba,preserve_alpha);
  if (!bVar1) {
    block_colors[3].field_0._3_1_ =
         (((int)(char)(*pBlock << 5) >> 5) + ((int)(uint)*pBlock >> 3) & 0x20U) != 0;
    block_colors[3].field_0._2_1_ =
         (((int)(char)(*(char *)((long)pBlock + 1) << 5) >> 5) +
          ((int)(uint)*(byte *)((long)pBlock + 1) >> 3) & 0x20U) != 0;
    block = (etc1_block *)pDst_pixels_rgba;
    if (((bool)block_colors[3].field_0._3_1_) || ((bool)block_colors[3].field_0._2_1_)) {
      local_b8 = (color_quad_u8 *)&c;
      do {
        color_quad_u8::color_quad_u8(local_b8);
        local_b8 = local_b8 + 1;
      } while (local_b8 != block_colors + 2);
      if ((block_colors[3].field_0.field_0.a & 1) == 0) {
        local_5b[0] = (byte)((int)(uint)*pBlock >> 3) & 0xf |
                      (*(byte *)((long)pBlock + 2) & 0x78) << 1;
        local_5b[1] = (byte)((int)(uint)*(byte *)((long)pBlock + 1) >> 4) & 1 | (*pBlock & 7) << 1 |
                      (byte)((int)(uint)*(byte *)((long)pBlock + 3) >> 3) & 0x10 |
                      *(char *)((long)pBlock + 2) << 5;
        modifier = (byte)((int)(uint)*(byte *)((long)pBlock + 2) >> 7) |
                   (*(byte *)((long)pBlock + 1) & 3) << 1 | *(byte *)((long)pBlock + 1) & 8 |
                   (*(byte *)((long)pBlock + 3) & 0x78) << 1;
        c_1._3_1_ = *(byte *)((long)pBlock + 3) & 4 | (*(byte *)((long)pBlock + 3) & 1) << 1 | 1;
        iStack_68 = 0;
        c_2 = 0;
        while (iStack_68 == 0 && (int)c_2 < 3) {
          iStack_68 = (local_5b[(int)c_2] & 0xf) - ((int)(uint)local_5b[(int)c_2] >> 4);
          c_2 = c_2 + 1;
          bVar11 = 7;
          if (iStack_68 < 0) {
            bVar11 = 6;
          }
          c_1._3_1_ = c_1._3_1_ & bVar11;
        }
        bVar11 = *(byte *)((long)&g_etc2_modifier_table + (ulong)c_1._3_1_);
        for (i = 0; i < 3; i = i + 1) {
          bVar2 = local_5b[i] << 4 | local_5b[i] & 0xf;
          bVar3 = (byte)((int)(uint)local_5b[i] >> 4) | local_5b[i] & 0xf0;
          iVar7 = math::maximum<int>(0,(uint)bVar3 - (uint)bVar11);
          pcVar10 = color_quad_u8::operator[]((color_quad_u8 *)&c,i);
          *pcVar10 = (component_t)iVar7;
          iVar7 = math::minimum<int>(0xff,(uint)bVar3 + (uint)bVar11);
          pcVar10 = color_quad_u8::operator[]((color_quad_u8 *)&delta,i);
          *pcVar10 = (component_t)iVar7;
          iVar7 = math::minimum<int>(0xff,(uint)bVar2 + (uint)bVar11);
          pcVar10 = color_quad_u8::operator[](block_colors,i);
          *pcVar10 = (component_t)iVar7;
          iVar7 = math::maximum<int>(0,(uint)bVar2 - (uint)bVar11);
          pcVar10 = color_quad_u8::operator[](block_colors + 1,i);
          *pcVar10 = (component_t)iVar7;
        }
      }
      else {
        local_5b[0] = *pBlock & 3 | (byte)((int)(uint)*pBlock >> 1) & 0xc |
                      *(byte *)((long)pBlock + 2) & 0xf0;
        local_5b[1] = (byte)((int)(uint)*(byte *)((long)pBlock + 1) >> 4) |
                      *(char *)((long)pBlock + 2) << 4;
        modifier = *(byte *)((long)pBlock + 1) & 0xf | *(byte *)((long)pBlock + 3) & 0xf0;
        bVar11 = *(byte *)((long)&g_etc2_modifier_table +
                          (long)(int)(*(byte *)((long)pBlock + 3) & 1 |
                                     (int)(uint)*(byte *)((long)pBlock + 3) >> 1 & 6U));
        for (d = 0; (uint)d < 3; d = d + 1) {
          bVar2 = local_5b[(uint)d];
          bVar3 = local_5b[(uint)d];
          pbVar9 = color_quad_u8::operator[](block_colors,d);
          *pbVar9 = bVar2 << 4 | bVar3 & 0xf;
          bVar2 = local_5b[(uint)d];
          bVar3 = local_5b[(uint)d];
          pbVar9 = color_quad_u8::operator[]((color_quad_u8 *)&delta,d);
          *pbVar9 = (byte)((int)(uint)bVar2 >> 4) | bVar3 & 0xf0;
          pbVar9 = color_quad_u8::operator[]((color_quad_u8 *)&delta,d);
          iVar7 = math::maximum<int>(0,(uint)*pbVar9 - (uint)bVar11);
          pcVar10 = color_quad_u8::operator[]((color_quad_u8 *)&c,d);
          *pcVar10 = (component_t)iVar7;
          pbVar9 = color_quad_u8::operator[]((color_quad_u8 *)&delta,d);
          iVar7 = math::minimum<int>(0xff,(uint)*pbVar9 + (uint)bVar11);
          pcVar10 = color_quad_u8::operator[](block_colors + 1,d);
          *pcVar10 = (component_t)iVar7;
        }
      }
      base[1] = 0;
      base[2] = 0;
      for (; (uint)base._2_4_ < 4; base._2_4_ = base._2_4_ + 1) {
        for (stack0xffffffffffffff80 = 0; stack0xffffffffffffff80 < 4;
            register0x00000000 = stack0xffffffffffffff80 + 1) {
          uVar8 = etc1_block::get_selector((etc1_block *)pBlock,stack0xffffffffffffff80,base._2_4_);
          color_quad_u8::set_rgb((color_quad_u8 *)block,(color_quad_u8 *)(&c + uVar8));
          if (!preserve_alpha) {
            (block->field_0).m_bytes[3] = 0xff;
          }
          block = (etc1_block *)((long)&block->field_0 + 4);
        }
      }
    }
    else {
      di[2] = (*pBlock & 0x7e) << 1 | (ushort)((int)(uint)*pBlock >> 5) & 3;
      uVar4 = (*pBlock & 1) << 7 | *(byte *)((long)pBlock + 1) & 0x7e | *pBlock & 1;
      uVar5 = (*(byte *)((long)pBlock + 1) & 1) << 7 | (*(byte *)((long)pBlock + 2) & 0x18) << 2 |
              (*(byte *)((long)pBlock + 2) & 3) << 3 |
              (ushort)((int)(uint)*(byte *)((long)pBlock + 3) >> 5) & 4 |
              (*(byte *)((long)pBlock + 1) & 1) << 1 |
              (ushort)((int)(uint)*(byte *)((long)pBlock + 2) >> 4) & 1;
      c_3._2_2_ = ((*(byte *)((long)pBlock + 5) & 7) << 5 |
                   (ushort)((int)(uint)*(byte *)((long)pBlock + 6) >> 3) & 0x1c |
                  (ushort)((int)(uint)*(byte *)((long)pBlock + 5) >> 1) & 3) - di[2];
      color[0] = ((*(byte *)((long)pBlock + 6) & 0x1f) << 3 |
                  (ushort)((int)(uint)*(byte *)((long)pBlock + 7) >> 5) & 6 |
                 (ushort)((int)(uint)*(byte *)((long)pBlock + 6) >> 4) & 1) - uVar4;
      color[1] = ((*(byte *)((long)pBlock + 7) & 0x3f) << 2 |
                 (ushort)((int)(uint)*(byte *)((long)pBlock + 7) >> 4) & 3) - uVar5;
      color[2] = ((*(byte *)((long)pBlock + 3) & 0x7c) << 1 | (*(byte *)((long)pBlock + 3) & 1) << 2
                 | (ushort)((int)(uint)*(byte *)((long)pBlock + 3) >> 5) & 3) - di[2];
      di[0] = (*(byte *)((long)pBlock + 4) & 0xfe |
              (ushort)((int)(uint)*(byte *)((long)pBlock + 4) >> 7)) - uVar4;
      di[1] = ((*(byte *)((long)pBlock + 4) & 1) << 7 |
               (ushort)((int)(uint)*(byte *)((long)pBlock + 5) >> 1) & 0x7c |
               (*(byte *)((long)pBlock + 4) & 1) << 1 |
              (ushort)((int)(uint)*(byte *)((long)pBlock + 5) >> 7)) - uVar5;
      for (c_4 = 0; c_4 < 3; c_4 = c_4 + 1) {
        di[(ulong)c_4 + 2] = di[(ulong)c_4 + 2] * 4 + 2;
      }
      for (j_1 = 0; j_1 < 4; j_1 = j_1 + 1) {
        for (c_5 = 0; c_5 < 3; c_5 = c_5 + 1) {
          *(int16 *)((long)&i_1 + (ulong)c_5 * 2) = di[(ulong)c_5 + 2];
          di[(ulong)c_5 + 2] = di[(ulong)c_5 + 2] + color[(ulong)c_5 - 1];
        }
        for (local_a8 = 0; local_a8 < 4; local_a8 = local_a8 + 1) {
          for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
            sVar6 = math::clamp<short>(*(short *)((long)&i_1 + (ulong)local_ac * 2),0,0x3fc);
            block->m_low_color[(ulong)local_ac - 8] = (uint8)(sVar6 >> 2);
            *(short *)((long)&i_1 + (ulong)local_ac * 2) =
                 *(short *)((long)&i_1 + (ulong)local_ac * 2) + color[(ulong)local_ac + 2];
          }
          if (!preserve_alpha) {
            (block->field_0).m_bytes[3] = 0xff;
          }
          block = (etc1_block *)((long)&block->field_0 + 4);
        }
      }
    }
  }
  return true;
}

Assistant:

bool unpack_etc2_color(const void* pBlock, unsigned int* pDst_pixels_rgba, bool preserve_alpha)
        {
            if (unpack_etc1_block(pBlock, pDst_pixels_rgba, preserve_alpha))
            {
                return true;
            }

            color_quad_u8* pDst = reinterpret_cast<color_quad_u8*>(pDst_pixels_rgba);
            const etc1_block& block = *static_cast<const etc1_block*>(pBlock);
            const uint8* B = block.m_bytes;
            const bool rOverflow = ((int8(B[0] << 5) >> 5) + (B[0] >> 3)) & 0x20;
            const bool gOverflow = ((int8(B[1] << 5) >> 5) + (B[1] >> 3)) & 0x20;

            if (rOverflow || gOverflow)
            {
                color_quad_u8 block_colors[4];
                uint8 unpacked[3];
                if (rOverflow)
                {
                    unpacked[0] = (B[0] & 0x3) | (B[0] >> 1 & 0xC) | (B[2] & 0xF0);
                    unpacked[1] = B[1] >> 4 | B[2] << 4;
                    unpacked[2] = (B[1] & 0xF) | (B[3] & 0xF0);
                    uint8 delta = g_etc2_modifier_table[(B[3] & 1) | (B[3] >> 1 & 6)];
                    for (uint c = 0; c < 3; c++)
                    {
                        block_colors[2][c] = unpacked[c] << 4 | (unpacked[c] & 0xF);
                        block_colors[1][c] = unpacked[c] >> 4 | (unpacked[c] & 0xF0);
                        block_colors[0][c] = math::maximum(0, block_colors[1][c] - delta);
                        block_colors[3][c] = math::minimum(255, block_colors[1][c] + delta);
                    }
                }
                else
                {
                    unpacked[0] = (B[0] >> 3 & 0xF) | (B[2] << 1 & 0xF0);
                    unpacked[1] = (B[1] >> 4 & 0x1) | (B[0] << 1 & 0xE) | (B[3] >> 3 & 0x10) | B[2] << 5;
                    unpacked[2] = B[2] >> 7 | (B[1] << 1 & 0x6) | (B[1] & 0x8) | (B[3] << 1 & 0xF0);
                    uint8 modifier = (B[3] & 4) | (B[3] << 1 & 2) | 1;
                    for (int d = 0, c = 0; !d && c < 3; c++, modifier &= d < 0 ? 6 : 7)
                    {
                        d = (unpacked[c] & 0xF) - (unpacked[c] >> 4);
                    }
                    uint8 delta = g_etc2_modifier_table[modifier];
                    for (uint c = 0; c < 3; c++)
                    {
                        uint8 c0 = unpacked[c] << 4 | (unpacked[c] & 0xF);
                        uint8 c1 = unpacked[c] >> 4 | (unpacked[c] & 0xF0);
                        block_colors[0][c] = math::maximum(0, c1 - delta);
                        block_colors[1][c] = math::minimum(255, c1 + delta);
                        block_colors[2][c] = math::minimum(255, c0 + delta);
                        block_colors[3][c] = math::maximum(0, c0 - delta);
                    }
                }
                for (uint i = 0; i < 4; i++)
                {
                    for (uint j = 0; j < 4; j++, pDst++)
                    {
                        pDst->set_rgb(block_colors[block.get_selector(j, i)]);
                        if (!preserve_alpha)
                        {
                            pDst->a = 255;
                        }
                    }
                }
            }
            else
            {
                int16 base[3], dj[3], di[3], color[3];
                base[0] = (B[0] << 1 & 0xFC) | (B[0] >> 5 & 3);
                base[1] = (B[0] << 7 & 0x80) | (B[1] & 0x7E) | (B[0] & 1);
                base[2] = (B[1] << 7 & 0x80) | (B[2] << 2 & 0x60) | (B[2] << 3 & 0x18) | (B[3] >> 5 & 4) | (B[1] << 1 & 2) | (B[2] >> 4 & 1);
                di[0] = ((B[5] << 5 & 0xE0) | (B[6] >> 3 & 0x1C) | (B[5] >> 1 & 0x3)) - base[0];
                di[1] = ((B[6] << 3 & 0xF8) | (B[7] >> 5 & 0x6) | (B[6] >> 4 & 0x1)) - base[1];
                di[2] = ((B[7] << 2 & 0xFC) | (B[7] >> 4 & 0x3)) - base[2];
                dj[0] = ((B[3] << 1 & 0xF8) | (B[3] << 2 & 0x4) | (B[3] >> 5 & 0x3)) - base[0];
                dj[1] = ((B[4] & 0xFE) | B[4] >> 7) - base[1];
                dj[2] = ((B[4] << 7 & 0x80) | (B[5] >> 1 & 0x7C) | (B[4] << 1 & 0x2) | B[5] >> 7) - base[2];
                for (uint c = 0; c < 3; c++)
                {
                    base[c] = (base[c] << 2) + 2;
                }
                for (uint i = 0; i < 4; i++)
                {
                    for (uint c = 0; c < 3; base[c] += di[c], c++)
                    {
                        color[c] = base[c];
                    }
                    for (uint j = 0; j < 4; j++, pDst++)
                    {
                        for (uint c = 0; c < 3; color[c] += dj[c], c++)
                        {
                            pDst->c[c] = math::clamp<int16>(color[c], 0, 1020) >> 2;
                        }
                        if (!preserve_alpha)
                        {
                            pDst->a = 255;
                        }
                    }
                }
            }
            return true;
        }